

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ssize_t __thiscall
pugi::xml_writer_stream::write(xml_writer_stream *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  size_t size_local;
  void *data_local;
  xml_writer_stream *this_local;
  
  if (this->narrow_stream == (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
    if (this->wide_stream == (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)0x0) {
      __assert_fail("wide_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/pugixml.cpp"
                    ,0xfea,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
    }
    if (((ulong)__buf & 3) != 0) {
      __assert_fail("size % sizeof(wchar_t) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/pugixml.cpp"
                    ,0xfeb,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
    }
    sVar1 = std::wostream::write((wchar_t *)this->wide_stream,CONCAT44(in_register_00000034,__fd));
  }
  else {
    if (this->wide_stream != (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)0x0) {
      __assert_fail("!wide_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/pugixml.cpp"
                    ,0xfe5,"virtual void pugi::xml_writer_stream::write(const void *, size_t)");
    }
    sVar1 = std::ostream::write((char *)this->narrow_stream,CONCAT44(in_register_00000034,__fd));
  }
  return sVar1;
}

Assistant:

PUGI__FN void xml_writer_stream::write(const void* data, size_t size)
	{
		if (narrow_stream)
		{
			assert(!wide_stream);
			narrow_stream->write(reinterpret_cast<const char*>(data), static_cast<std::streamsize>(size));
		}
		else
		{
			assert(wide_stream);
			assert(size % sizeof(wchar_t) == 0);

			wide_stream->write(reinterpret_cast<const wchar_t*>(data), static_cast<std::streamsize>(size / sizeof(wchar_t)));
		}
	}